

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

_Bool Curl_cpool_conn_now_idle(Curl_easy *data,connectdata *conn)

{
  byte bVar1;
  Curl_multi *pCVar2;
  Curl_share *pCVar3;
  curl_trc_feat *pcVar4;
  byte bVar5;
  connectdata *conn_00;
  cpool *cpool;
  uint uVar6;
  _Bool _Var7;
  curltime cVar8;
  
  pCVar2 = data->multi;
  uVar6 = pCVar2->maxconnects;
  if (uVar6 == 0) {
    uVar6 = pCVar2->num_easy << 2;
  }
  pCVar3 = data->share;
  if ((pCVar3 == (Curl_share *)0x0) || ((pCVar3->specifier & 0x20) == 0)) {
    if (data->multi_easy == (Curl_multi *)0x0) {
      cpool = &pCVar2->cpool;
    }
    else {
      cpool = &data->multi_easy->cpool;
    }
  }
  else {
    cpool = &pCVar3->cpool;
  }
  cVar8 = Curl_now();
  (conn->lastused).tv_sec = cVar8.tv_sec;
  (conn->lastused).tv_usec = cVar8.tv_usec;
  if (uVar6 == 0) {
    _Var7 = true;
  }
  else {
    bVar1 = cpool->field_0x98;
    if ((bVar1 & 1) == 0) {
      bVar5 = bVar1;
      if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
        Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
        bVar5 = cpool->field_0x98;
      }
      cpool->field_0x98 = bVar5 | 1;
    }
    _Var7 = true;
    if ((ulong)uVar6 < cpool->num_conn) {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
      {
        Curl_infof(data,"Connection pool is full, closing the oldest one");
      }
      conn_00 = cpool_get_oldest_idle(cpool);
      _Var7 = conn_00 != conn;
      if (conn_00 != (connectdata *)0x0) {
        Curl_cpool_disconnect(cpool->idata,conn_00,false);
      }
    }
    if ((bVar1 & 1) == 0) {
      cpool->field_0x98 = cpool->field_0x98 & 0xfe;
      if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
        Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
      }
    }
  }
  return _Var7;
}

Assistant:

bool Curl_cpool_conn_now_idle(struct Curl_easy *data,
                              struct connectdata *conn)
{
  unsigned int maxconnects = !data->multi->maxconnects ?
    data->multi->num_easy * 4 : data->multi->maxconnects;
  struct connectdata *oldest_idle = NULL;
  struct cpool *cpool = cpool_get_instance(data);
  bool kept = TRUE;

  conn->lastused = Curl_now(); /* it was used up until now */
  if(cpool && maxconnects) {
    /* may be called form a callback already under lock */
    bool do_lock = !CPOOL_IS_LOCKED(cpool);
    if(do_lock)
      CPOOL_LOCK(cpool);
    if(cpool->num_conn > maxconnects) {
      infof(data, "Connection pool is full, closing the oldest one");

      oldest_idle = cpool_get_oldest_idle(cpool);
      kept = (oldest_idle != conn);
      if(oldest_idle) {
        Curl_cpool_disconnect(cpool->idata, oldest_idle, FALSE);
      }
    }
    if(do_lock)
      CPOOL_UNLOCK(cpool);
  }

  return kept;
}